

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automations.cpp
# Opt level: O3

bool __thiscall rtosc::AutomationMgr::handleMidi(AutomationMgr *this,int channel,int type,int val)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  AutomationSlot *pAVar5;
  bool bVar6;
  bool bVar7;
  int *piVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  
  if (((type - 0x26U < 0x3e) && ((0x3000000000000001U >> ((ulong)(type - 0x26U) & 0x3f) & 1) != 0))
     || (type == 6)) {
    setparameternumber(this,type,val);
    iVar1 = (this->NRPN).parhi;
    if (((iVar1 < 0) || (iVar10 = (this->NRPN).parlo, iVar10 < 0)) ||
       ((iVar2 = (this->NRPN).valhi, iVar2 < 0 || (iVar3 = (this->NRPN).vallo, iVar3 < 0)))) {
      bVar7 = false;
      iVar10 = 0;
    }
    else {
      iVar10 = iVar10 + iVar1 * 0x80;
      uVar9 = (ulong)(uint)this->nslots;
      if (0 < this->nslots) {
        lVar11 = 0;
        bVar6 = false;
        do {
          piVar8 = &this->slots[lVar11].midi_nrpn;
          while (*piVar8 != iVar10) {
            lVar11 = lVar11 + 1;
            piVar8 = piVar8 + 0x28;
            if ((int)uVar9 <= lVar11) {
              bVar7 = true;
              if (bVar6) {
                return true;
              }
              goto LAB_001129ee;
            }
          }
          setSlot(this,(int)lVar11,(float)(iVar3 + iVar2 * 0x80) / 16383.0);
          uVar9 = (ulong)this->nslots;
          lVar11 = lVar11 + 1;
          bVar6 = true;
          if ((long)uVar9 <= lVar11) {
            return true;
          }
        } while( true );
      }
      bVar7 = true;
    }
  }
  else {
    iVar10 = channel * 0x80 + type;
    uVar9 = (ulong)(uint)this->nslots;
    if (0 < this->nslots) {
      lVar11 = 0;
      bVar7 = false;
      do {
        piVar8 = &this->slots[lVar11].midi_cc;
        while (*piVar8 != iVar10) {
          lVar11 = lVar11 + 1;
          piVar8 = piVar8 + 0x28;
          if ((int)uVar9 <= lVar11) {
            if (bVar7) {
              return true;
            }
            goto LAB_00112b0b;
          }
        }
        setSlot(this,(int)lVar11,(float)val / 127.0);
        uVar9 = (ulong)this->nslots;
        lVar11 = lVar11 + 1;
        bVar7 = true;
        if ((long)uVar9 <= lVar11) {
          return true;
        }
      } while( true );
    }
LAB_00112b0b:
    bVar7 = false;
  }
LAB_001129ee:
  uVar4 = this->nslots;
  if (0 < (long)(int)uVar4) {
    pAVar5 = this->slots;
    piVar8 = &pAVar5->learning;
    lVar11 = 0;
    do {
      if (*piVar8 == 1) {
        *piVar8 = -1;
        if (bVar7) {
          piVar8[2] = iVar10;
        }
        else {
          piVar8[1] = iVar10;
        }
        uVar9 = (ulong)uVar4;
        piVar8 = &pAVar5->learning;
        do {
          if (1 < *piVar8) {
            *piVar8 = *piVar8 + -1;
          }
          piVar8 = piVar8 + 0x28;
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
        this->learn_queue_len = this->learn_queue_len + -1;
        setSlot(this,(int)lVar11,(float)val / 127.0);
        this->damaged = 1;
        return false;
      }
      lVar11 = lVar11 + 1;
      piVar8 = piVar8 + 0x28;
    } while ((int)uVar4 != lVar11);
  }
  return false;
}

Assistant:

bool AutomationMgr::handleMidi(int channel, int type, int val)
{
    bool is_nrpn = false;
    int par_id = 0;
    int value;
    if((type == C_dataentryhi) || (type == C_dataentrylo)
       || (type == C_nrpnhi) || (type == C_nrpnlo)) { //Process RPN and NRPN by the Master (ignore the chan)
        
        setparameternumber(type, val);

        int parhi = -1, parlo = -1, valhi = -1, vallo = -1;
        if(getnrpn(&parhi, &parlo, &valhi, &vallo) == 0){ //this is NRPN
            is_nrpn = true;
            par_id = (parhi<<7) + parlo;
            value = (valhi<<7) + vallo;
            bool bound_nrpn = false;
            for(int i=0; i<nslots; ++i) {
                if(slots[i].midi_nrpn == par_id) {
                    bound_nrpn = true;
                    setSlot(i, value/16383.0);
                }
            }

        if(bound_nrpn)
            return 1;
        }
        
    }
    else {
        
        par_id = channel*128 + type;

        bool bound_cc = false;
        for(int i=0; i<nslots; ++i) {
            if(slots[i].midi_cc == par_id) {
                bound_cc = true;
                setSlot(i, val/127.0);
            }
        }

        if(bound_cc)
            return 1;
        
    }

    //No bound CC, now to see if there's something to learn
    for(int i=0; i<nslots; ++i) {
        if(slots[i].learning == 1) {
            slots[i].learning = -1;
            if (is_nrpn)
                slots[i].midi_nrpn = par_id;
            else
                slots[i].midi_cc = par_id;
            for(int j=0; j<nslots; ++j)
                if(slots[j].learning > 1)
                    slots[j].learning -= 1;
            learn_queue_len--;
            setSlot(i, val/127.0);
            damaged = 1;
            break;
        }
    }
    return 0;
}